

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CCallMethodExp *exp)

{
  element_type *peVar1;
  pointer pcVar2;
  IExpression *pIVar3;
  CIdExp *pCVar4;
  _Alloc_hider _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  CError *this_02;
  CExpList *pCVar7;
  pointer puVar8;
  pointer got;
  element_type *peVar9;
  undefined8 *puVar10;
  element_type *peVar11;
  undefined3 uVar12;
  TPrimitiveType TVar13;
  CCallMethodExp *pCVar14;
  bool bVar15;
  mapped_type *pmVar16;
  ostream *poVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  TypeInfo *got_00;
  CError *expected;
  long lVar21;
  long lVar22;
  string errorMessage;
  string methodName;
  string identifierName;
  string errorMessage_1;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  char local_138 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  CTypeCheckerVisitor *local_108;
  TypeInfo *local_100;
  CCallMethodExp *local_f8;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  char local_e0 [8];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  shared_ptr<ClassInfo> local_a8;
  key_type local_98;
  element_type *local_78;
  string *local_70;
  vector<CError,_std::allocator<CError>_> *local_68;
  long local_60;
  element_type *local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: CCallMethodExp\n",0x1c);
  if (((exp->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
       super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
       super__Head_base<0UL,_CExpList_*,_false>._M_head_impl == (CExpList *)0x0) ||
     ((exp->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl == (CIdExp *)0x0)) {
    CError::CError((CError *)local_148,&CError::AST_ERROR_abi_cxx11_,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_148);
    if (local_148 != (undefined1  [8])local_138) {
      operator_delete((void *)local_148);
    }
    TypeInfo::TypeInfo((TypeInfo *)local_148,ERROR_TYPE);
    (this->lastCalculatedType).isPrimitive = (bool)local_148[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_148._1_3_;
    (this->lastCalculatedType).type = local_148._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_140);
    paVar20 = &local_130;
    goto LAB_0011ff04;
  }
  peVar1 = (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (peVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (peVar1->name)._M_string_length);
  pIVar3 = (exp->objectExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar3 == (IExpression *)0x0) {
LAB_0011f91e:
    pCVar4 = (exp->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t
             .super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    local_c8._0_8_ = &local_b8;
    _Var5._M_p = (pCVar4->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,_Var5._M_p,_Var5._M_p + (pCVar4->name)._M_string_length);
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(this->table).
                              super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &local_98);
    peVar1 = (pmVar16->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (pmVar16->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_f8 = exp;
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_c8._0_8_,local_c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(peVar1->name)._M_dataplus._M_p,(peVar1->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    poVar17 = std::ostream::_M_insert<bool>(SUB81(poVar17,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
    pCVar14 = local_f8;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_a8.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_a8.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    bVar15 = checkMethodVisibility(this,(string *)local_c8,&local_a8,pIVar3 == (IExpression *)0x0);
    if (local_a8.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (bVar15) {
      pmVar18 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&peVar1->methods,(key_type *)local_c8);
      peVar6 = (pmVar18->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (pmVar18->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_58 = (peVar6->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      this_02 = (CError *)(local_58->variables)._M_h._M_element_count;
      pCVar7 = (pCVar14->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>.
               _M_t.super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
               super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
      puVar8 = *(pointer *)
                &(pCVar7->exps).
                 super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                 ._M_impl;
      got = *(pointer *)
             ((long)&(pCVar7->exps).
                     super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
             + 8);
      expected = (CError *)((long)got - (long)puVar8 >> 3);
      if (this_02 == expected) {
        local_110 = (peVar6->arguments).
                    super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_110->_M_use_count = local_110->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_110->_M_use_count = local_110->_M_use_count + 1;
          }
        }
        local_108 = this;
        local_78 = peVar6;
        if (got != puVar8) {
          local_100 = &this->lastCalculatedType;
          local_68 = &this->errors;
          local_70 = (string *)&(this->lastCalculatedType).className;
          local_60 = (long)&(expected->message)._M_dataplus._M_p +
                     (ulong)(expected == (CError *)0x0);
          lVar22 = 0;
          lVar21 = 0;
          do {
            pmVar19 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_58,
                                   (key_type *)
                                   (*(long *)&(local_58->variableNames).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data + lVar22));
            peVar9 = (pmVar19->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_118 = (pmVar19->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi;
            if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_118->_M_use_count = local_118->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_118->_M_use_count = local_118->_M_use_count + 1;
              }
            }
            puVar10 = *(undefined8 **)
                       (*(long *)&(((local_f8->args)._M_t.
                                    super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>
                                    .super__Head_base<0UL,_CExpList_*,_false>._M_head_impl)->exps).
                                  super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                                  ._M_impl + lVar21 * 8);
            if (puVar10 != (undefined8 *)0x0) {
              (**(code **)*puVar10)(puVar10,local_108);
              peVar11 = (peVar9->type).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              local_f0 = peVar11->isPrimitive;
              got_00 = (TypeInfo *)local_d8;
              pcVar2 = (peVar11->className)._M_dataplus._M_p;
              local_e8._M_p = (pointer)got_00;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar2,pcVar2 + (peVar11->className)._M_string_length);
              bVar15 = operator!=(local_100,(TypeInfo *)local_f0);
              if (bVar15) {
                CError::GetTypeErrorMessage_abi_cxx11_
                          (&local_50,(CError *)local_f0,local_100,got_00);
                CError::CError((CError *)local_148,&local_50,
                               (PositionInfo *)
                               (*(long *)(*(long *)&(((local_f8->args)._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>
                                                  .super__Head_base<0UL,_CExpList_*,_false>.
                                                  _M_head_impl)->exps).
                                                  super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                                                  ._M_impl + lVar21 * 8) + 8));
                std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                          (local_68,(CError *)local_148);
                if (local_148 != (undefined1  [8])local_138) {
                  operator_delete((void *)local_148);
                }
                TypeInfo::TypeInfo((TypeInfo *)local_148,ERROR_TYPE);
                local_100->isPrimitive = (bool)local_148[0];
                *(undefined3 *)&local_100->field_0x1 = local_148._1_3_;
                local_100->type = local_148._4_4_;
                std::__cxx11::string::operator=(local_70,(string *)&local_140);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_p != &local_130) {
                  operator_delete(local_140._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                if ((TypeInfo *)local_e8._M_p != (TypeInfo *)local_d8) {
                  operator_delete(local_e8._M_p);
                }
                if (bVar15) {
                  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
                  }
                  goto LAB_0011fea8;
                }
              }
              else if ((TypeInfo *)local_e8._M_p != (TypeInfo *)local_d8) {
                operator_delete(local_e8._M_p);
              }
            }
            if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
            }
            lVar21 = lVar21 + 1;
            lVar22 = lVar22 + 0x20;
          } while (local_60 != lVar21);
        }
        peVar11 = (local_78->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        uVar12 = *(undefined3 *)&peVar11->field_0x1;
        TVar13 = peVar11->type;
        (local_108->lastCalculatedType).isPrimitive = peVar11->isPrimitive;
        *(undefined3 *)&(local_108->lastCalculatedType).field_0x1 = uVar12;
        (local_108->lastCalculatedType).type = TVar13;
        std::__cxx11::string::_M_assign((string *)&(local_108->lastCalculatedType).className);
LAB_0011fea8:
        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
        }
      }
      else {
        CError::GetNumberOfArgsMessage_abi_cxx11_
                  ((string *)local_f0,this_02,(unsigned_long)expected,(unsigned_long)got);
        CError::CError((CError *)local_148,(string *)local_f0,
                       &(pCVar14->super_IExpression).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_148);
        if (local_148 != (undefined1  [8])local_138) {
          operator_delete((void *)local_148);
        }
        TypeInfo::TypeInfo((TypeInfo *)local_148,ERROR_TYPE);
        (this->lastCalculatedType).isPrimitive = (bool)local_148[0];
        *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_148._1_3_;
        (this->lastCalculatedType).type = local_148._4_4_;
        std::__cxx11::string::operator=
                  ((string *)&(this->lastCalculatedType).className,(string *)&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_p != &local_130) {
          operator_delete(local_140._M_p);
        }
        if (local_f0 != (undefined1  [8])local_e0) {
          operator_delete((void *)local_f0);
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
    else {
      CError::GetHasNoMemberErrorMessage((string *)local_f0,&local_98,(string *)local_c8);
      CError::CError((CError *)local_148,(string *)local_f0,
                     (PositionInfo *)
                     ((long)&(((pCVar14->methodName)._M_t.
                               super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                               super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                               super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->
                             super_IExpression).super_PositionedNode + 8));
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_148);
      if (local_148 != (undefined1  [8])local_138) {
        operator_delete((void *)local_148);
      }
      if (local_f0 != (undefined1  [8])local_e0) {
        operator_delete((void *)local_f0);
      }
      TypeInfo::TypeInfo((TypeInfo *)local_148,ERROR_TYPE);
      (this->lastCalculatedType).isPrimitive = (bool)local_148[0];
      *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_148._1_3_;
      (this->lastCalculatedType).type = local_148._4_4_;
      std::__cxx11::string::operator=
                ((string *)&(this->lastCalculatedType).className,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_p != &local_130) {
        operator_delete(local_140._M_p);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    local_140._M_p = (pointer)local_c8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ != &local_b8) {
LAB_0011feef:
      operator_delete(local_140._M_p);
    }
  }
  else {
    (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
    TypeInfo::TypeInfo((TypeInfo *)local_148,ERROR_TYPE);
    bVar15 = operator==(&this->lastCalculatedType,(TypeInfo *)local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_p != &local_130) {
      operator_delete(local_140._M_p);
    }
    if (!bVar15) {
      std::__cxx11::string::_M_assign((string *)&local_98);
      if ((this->lastCalculatedType).isPrimitive != true) goto LAB_0011f91e;
      CError::CError((CError *)local_148,&CError::IS_NOT_CALLABLE_abi_cxx11_,
                     &(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_148);
      if (local_148 != (undefined1  [8])local_138) {
        operator_delete((void *)local_148);
      }
      TypeInfo::TypeInfo((TypeInfo *)local_148,ERROR_TYPE);
      (this->lastCalculatedType).isPrimitive = (bool)local_148[0];
      *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_148._1_3_;
      (this->lastCalculatedType).type = local_148._4_4_;
      std::__cxx11::string::operator=
                ((string *)&(this->lastCalculatedType).className,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_p == &local_130) goto LAB_0011fef4;
      goto LAB_0011feef;
    }
  }
LAB_0011fef4:
  paVar20 = &local_98.field_2;
  local_140._M_p = local_98._M_dataplus._M_p;
LAB_0011ff04:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != paVar20) {
    operator_delete(local_140._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CCallMethodExp &exp )
{
    std::cout << "typechecker: CCallMethodExp\n";

    if( exp.args && exp.methodName ) {
        std::string identifierName = currentClass->name;
        bool isThis = true;
        if ( exp.objectExpression ) {
            exp.objectExpression->Accept( *this );
            if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
                return;
            }
            identifierName = lastCalculatedType.className;
            isThis = false;
            if( lastCalculatedType.isPrimitive ) {
                errors.push_back( CError( CError::IS_NOT_CALLABLE, exp.position ) );
                lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
                return;
            }
        }

		auto methodName = exp.methodName->name;
        auto classInfo = table->classes[identifierName];
        std::cout << methodName << " " << classInfo->name << " " << isThis << "\n";
		if( !checkMethodVisibility( methodName, classInfo, isThis ) ) {
			errors.push_back( CError( CError::GetHasNoMemberErrorMessage( identifierName, methodName ), exp.methodName->position ) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
			return;
		}
		auto methodInfo = classInfo->methods[methodName];
		auto expectedNumberOfArguments = methodInfo->arguments->variables.size();
        auto gotNumberOfArguments = exp.args->exps.size();
        if( expectedNumberOfArguments != gotNumberOfArguments ) {
			auto errorMessage = CError::GetNumberOfArgsMessage( expectedNumberOfArguments, gotNumberOfArguments );
			errors.push_back( CError( errorMessage, exp.position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
			return;
		}
        auto argumentsInfo = methodInfo->arguments;
        for( int index = 0; index < gotNumberOfArguments; ++index ) {
            auto argumentInfo = argumentsInfo->variables[argumentsInfo->variableNames[index]];
            if( exp.args->exps[index] ) {
                exp.args->exps[index]->Accept( *this );
                auto expectedArgumentType = *( argumentInfo->type );
                if( lastCalculatedType != expectedArgumentType ) {
                    auto errorMessage = CError::GetTypeErrorMessage(expectedArgumentType, lastCalculatedType);
                    errors.push_back( CError( errorMessage, exp.args->exps[index]->position ) );
                    lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
                    return;
                }
            }
		}
		lastCalculatedType = *( methodInfo->returnType );
	} else {
		errors.push_back( CError( CError::AST_ERROR, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
    }
}